

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

Vec_Wrd_t * Abc_SuppGenPairs2(int nOnes,int nBits)

{
  int iVar1;
  Vec_Wrd_t *p;
  word *pwVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong Entry;
  
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pwVar2 = (word *)malloc(8000);
  p->pArray = pwVar2;
  if (nBits != 0x1f) {
    uVar5 = 1 << ((byte)nBits & 0x1f);
    if ((int)uVar5 < 2) {
      uVar5 = 1;
    }
    Entry = 0;
    do {
      uVar3 = (int)Entry - ((uint)(Entry >> 1) & 0x15555555);
      uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
      uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18;
      iVar1 = 1;
      do {
        iVar4 = iVar1;
        uVar3 = uVar3 - 2;
        if (nOnes < iVar4) break;
        iVar1 = iVar4 + 1;
      } while (uVar3 != 0);
      if (iVar4 <= nOnes) {
        Vec_WrdPush(p,Entry);
      }
      Entry = Entry + 1;
    } while (Entry != uVar5);
  }
  return p;
}

Assistant:

Vec_Wrd_t * Abc_SuppGenPairs2( int nOnes, int nBits )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    int i, k, Size = (1 << nBits), Value;
    for ( i = 0; i < Size; i++ )
    {
        Value = Abc_SuppCountOnes(i);
        for ( k = 1; k <= nOnes; k++ )
            if ( Value == 2*k )
                break;
        if ( k <= nOnes )
            Vec_WrdPush( vRes, i );
    }
    return vRes;
}